

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

IGeneratorTracker * __thiscall
Catch::RunContext::acquireGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo *lineInfo)

{
  size_t sVar1;
  GeneratorTracker *pGVar2;
  string sStack_78;
  NameAndLocation local_58;
  StringRef local_28;
  
  local_28.m_size = generatorName.m_size;
  local_28.m_start = generatorName.m_start;
  StringRef::operator_cast_to_string(&sStack_78,&local_28);
  std::__cxx11::string::string((string *)&local_58,&sStack_78);
  local_58.location.file = lineInfo->file;
  local_58.location.line = lineInfo->line;
  pGVar2 = Generators::GeneratorTracker::acquire(&this->m_trackerContext,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_78);
  sVar1 = lineInfo->line;
  (this->m_lastAssertionInfo).lineInfo.file = lineInfo->file;
  (this->m_lastAssertionInfo).lineInfo.line = sVar1;
  return &pGVar2->super_IGeneratorTracker;
}

Assistant:

auto RunContext::acquireGeneratorTracker(StringRef generatorName, SourceLineInfo const &lineInfo) -> IGeneratorTracker &{
        using namespace Generators;
        GeneratorTracker &tracker = GeneratorTracker::acquire(m_trackerContext,
            TestCaseTracking::NameAndLocation(static_cast<std::string>(generatorName), lineInfo));
        m_lastAssertionInfo.lineInfo = lineInfo;
        return tracker;
    }